

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtomTypesSectionParser.cpp
# Opt level: O0

void __thiscall
OpenMD::DirectionalAtomTypesSectionParser::parseLine
          (DirectionalAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  undefined8 uVar1;
  double *pdVar2;
  uint in_ECX;
  RealType RVar3;
  Mat3x3d I;
  DirectionalAdapter da;
  AtomType *atomType;
  string atomTypeName;
  int nTokens;
  StringTokenizer tokenizer;
  SquareMatrix3<double> *in_stack_fffffffffffffe28;
  StringTokenizer *in_stack_fffffffffffffe30;
  StringTokenizer *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  ForceField *in_stack_fffffffffffffe70;
  errorStruct *peVar4;
  Mat3x3d *in_stack_fffffffffffffec8;
  DirectionalAdapter *in_stack_fffffffffffffed0;
  StringTokenizer *in_stack_fffffffffffffed8;
  DirectionalAdapter local_e0;
  AtomType *local_d8;
  string local_d0 [32];
  int local_b0;
  allocator<char> local_99;
  string local_98 [124];
  uint local_1c;
  
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
             (allocator<char> *)in_stack_fffffffffffffe60);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             in_stack_fffffffffffffe60);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  local_b0 = StringTokenizer::countTokens(in_stack_fffffffffffffe40);
  if (local_b0 < 4) {
    peVar4 = &painCave;
    snprintf(painCave.errMsg,2000,
             "DirectionalAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)local_1c);
    peVar4->isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffed8);
    local_d8 = ForceField::getAtomType(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    if (local_d8 == (AtomType *)0x0) {
      uVar1 = std::__cxx11::string::c_str();
      peVar4 = &painCave;
      snprintf(painCave.errMsg,2000,
               "DirectionalAtomTypesSectionParser:: AtomType %s was not\n\tdeclared in the BaseAtomTypes or AtomTypes before being\n\tdeclared as a DirectionalAtomType!\n"
               ,uVar1);
      peVar4->isFatal = 1;
      simError();
    }
    DirectionalAdapter::DirectionalAdapter(&local_e0,local_d8);
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1ea504);
    RVar3 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe70);
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)&stack0xfffffffffffffed8,0,0);
    *pdVar2 = RVar3;
    RVar3 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe70);
    pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)&stack0xfffffffffffffed8,1,1);
    *pdVar2 = RVar3;
    RVar3 = StringTokenizer::nextTokenAsDouble((StringTokenizer *)in_stack_fffffffffffffe70);
    in_stack_fffffffffffffe30 =
         (StringTokenizer *)
         RectMatrix<double,_3U,_3U>::operator()
                   ((RectMatrix<double,_3U,_3U> *)&stack0xfffffffffffffed8,2,2);
    (((SquareMatrix<double,_3> *)&in_stack_fffffffffffffe30->tokenString_)->
    super_RectMatrix<double,_3U,_3U>).data_[0][0] = RVar3;
    SquareMatrix3<double>::SquareMatrix3
              ((SquareMatrix3<double> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    DirectionalAdapter::makeDirectional(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1ea5f2);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1ea5ff);
    std::__cxx11::string::~string(local_d0);
  }
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffe30);
  return;
}

Assistant:

void DirectionalAtomTypesSectionParser::parseLine(ForceField& ff,
                                                    const std::string& line,
                                                    int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in DirectionalAtomTypeSection, a line contains 4 tokens

    if (nTokens < 4) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DirectionalAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();

    } else {
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);

      if (atomType == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DirectionalAtomTypesSectionParser:: AtomType %s was not\n"
                 "\tdeclared in the BaseAtomTypes or AtomTypes before being\n"
                 "\tdeclared as a DirectionalAtomType!\n",
                 atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }

      DirectionalAdapter da = DirectionalAdapter(atomType);
      Mat3x3d I;

      I(0, 0) = tokenizer.nextTokenAsDouble();
      I(1, 1) = tokenizer.nextTokenAsDouble();
      I(2, 2) = tokenizer.nextTokenAsDouble();

      da.makeDirectional(I);
    }
  }